

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,float,duckdb::BinaryLambdaWrapper,bool,float(*)(float,float),false,true>
               (float *ldata,float *rdata,float *result_data,idx_t count,ValidityMask *mask,
               _func_float_float_float *fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  float fVar8;
  float fVar9;
  ulong local_58;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      fVar9 = *rdata;
      iVar7 = 0;
      do {
        fVar8 = (*fun)(ldata[iVar7],fVar9);
        result_data[iVar7] = fVar8;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    local_58 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar6 = count;
        }
LAB_002e8419:
        uVar3 = uVar4;
        if (uVar4 < uVar6) {
          fVar9 = *rdata;
          do {
            fVar8 = (*fun)(ldata[uVar4],fVar9);
            result_data[uVar4] = fVar8;
            uVar4 = uVar4 + 1;
            uVar3 = uVar6;
          } while (uVar6 != uVar4);
        }
      }
      else {
        uVar2 = puVar1[local_58];
        uVar6 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar6 = count;
        }
        uVar3 = uVar6;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_002e8419;
          uVar3 = uVar4;
          if (uVar4 < uVar6) {
            uVar5 = 0;
            do {
              if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
                fVar9 = (*fun)(ldata[uVar4 + uVar5],*rdata);
                result_data[uVar4 + uVar5] = fVar9;
              }
              uVar5 = uVar5 + 1;
              uVar3 = uVar6;
            } while (uVar6 - uVar4 != uVar5);
          }
        }
      }
      uVar4 = uVar3;
      local_58 = local_58 + 1;
    } while (local_58 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}